

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::Copy(aiBone **_dest,aiBone *src)

{
  aiBone *this;
  
  if (src == (aiBone *)0x0 || _dest == (aiBone **)0x0) {
    return;
  }
  this = (aiBone *)operator_new(0x460);
  aiBone::aiBone(this);
  *_dest = this;
  memcpy(this,src,0x460);
  GetArrayCopy<aiVertexWeight>(&this->mWeights,this->mNumWeights);
  return;
}

Assistant:

void SceneCombiner::Copy(aiBone** _dest, const aiBone* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiBone* dest = *_dest = new aiBone();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiBone));

    // and reallocate all arrays
    GetArrayCopy( dest->mWeights, dest->mNumWeights );
}